

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfAcesFile.cpp
# Opt level: O1

void __thiscall Imf_2_5::AcesInputFile::readPixels(AcesInputFile *this,int scanLine1,int scanLine2)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  short sVar11;
  unsigned_short uVar12;
  int iVar13;
  Data *pDVar14;
  int iVar15;
  Rgba *pRVar16;
  long lVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  
  RgbaInputFile::readPixels(this->_data->rgbaFile,scanLine1,scanLine2);
  if (this->_data->mustConvertColor == true) {
    iVar13 = scanLine1;
    if (scanLine2 < scanLine1) {
      iVar13 = scanLine2;
    }
    lVar17 = (long)iVar13;
    do {
      pDVar14 = this->_data;
      iVar15 = pDVar14->minX;
      if (iVar15 <= pDVar14->maxX) {
        pRVar16 = pDVar14->fbBase + (long)iVar15 * pDVar14->fbXStride + pDVar14->fbYStride * lVar17;
        iVar15 = iVar15 + -1;
        do {
          fVar1 = *(float *)((long)&half::_toFloat + (ulong)(pRVar16->r)._h * 4);
          fVar2 = *(float *)((long)&half::_toFloat + (ulong)(pRVar16->g)._h * 4);
          fVar3 = *(float *)((long)&half::_toFloat + (ulong)(pRVar16->b)._h * 4);
          fVar20 = (pDVar14->fileToAces).x[1][1];
          fVar4 = (pDVar14->fileToAces).x[0][1];
          fVar5 = (pDVar14->fileToAces).x[2][1];
          fVar6 = (pDVar14->fileToAces).x[3][1];
          fVar7 = (pDVar14->fileToAces).x[1][2];
          fVar8 = (pDVar14->fileToAces).x[0][2];
          fVar9 = (pDVar14->fileToAces).x[2][2];
          fVar10 = (pDVar14->fileToAces).x[3][2];
          fVar19 = (pDVar14->fileToAces).x[3][3] +
                   (pDVar14->fileToAces).x[2][3] * fVar3 +
                   fVar1 * (pDVar14->fileToAces).x[0][3] + (pDVar14->fileToAces).x[1][3] * fVar2;
          fVar18 = ((pDVar14->fileToAces).x[3][0] +
                   (pDVar14->fileToAces).x[2][0] * fVar3 +
                   fVar1 * (pDVar14->fileToAces).x[0][0] + (pDVar14->fileToAces).x[1][0] * fVar2) /
                   fVar19;
          if ((fVar18 != 0.0) || (NAN(fVar18))) {
            sVar11 = *(short *)((long)&half::_eLut + (ulong)((uint)fVar18 >> 0x17) * 2);
            if (sVar11 == 0) {
              uVar12 = half::convert((int)fVar18);
            }
            else {
              uVar12 = sVar11 + (short)(((uint)fVar18 & 0x7fffff) + 0xfff +
                                        (uint)(((uint)fVar18 >> 0xd & 1) != 0) >> 0xd);
            }
          }
          else {
            uVar12 = (unsigned_short)((uint)fVar18 >> 0x10);
          }
          fVar20 = (fVar5 * fVar3 + fVar4 * fVar1 + fVar20 * fVar2 + fVar6) / fVar19;
          (pRVar16->r)._h = uVar12;
          if ((fVar20 != 0.0) || (NAN(fVar20))) {
            sVar11 = *(short *)((long)&half::_eLut + (ulong)((uint)fVar20 >> 0x17) * 2);
            if (sVar11 == 0) {
              uVar12 = half::convert((int)fVar20);
            }
            else {
              uVar12 = sVar11 + (short)(((uint)fVar20 & 0x7fffff) + 0xfff +
                                        (uint)(((uint)fVar20 >> 0xd & 1) != 0) >> 0xd);
            }
          }
          else {
            uVar12 = (unsigned_short)((uint)fVar20 >> 0x10);
          }
          fVar19 = (fVar9 * fVar3 + fVar8 * fVar1 + fVar7 * fVar2 + fVar10) / fVar19;
          (pRVar16->g)._h = uVar12;
          if ((fVar19 != 0.0) || (NAN(fVar19))) {
            sVar11 = *(short *)((long)&half::_eLut + (ulong)((uint)fVar19 >> 0x17) * 2);
            if (sVar11 == 0) {
              uVar12 = half::convert((int)fVar19);
            }
            else {
              uVar12 = sVar11 + (short)(((uint)fVar19 & 0x7fffff) + 0xfff +
                                        (uint)(((uint)fVar19 >> 0xd & 1) != 0) >> 0xd);
            }
          }
          else {
            uVar12 = (unsigned_short)((uint)fVar19 >> 0x10);
          }
          (pRVar16->b)._h = uVar12;
          pDVar14 = this->_data;
          pRVar16 = pRVar16 + pDVar14->fbXStride;
          iVar15 = iVar15 + 1;
        } while (iVar15 < pDVar14->maxX);
      }
      lVar17 = lVar17 + 1;
    } while (((scanLine1 + scanLine2) - iVar13) + 1 != (int)lVar17);
  }
  return;
}

Assistant:

void		
AcesInputFile::readPixels (int scanLine1, int scanLine2)
{
    //
    // Copy the pixels from the RgbaInputFile into the frame buffer.
    //

    _data->rgbaFile->readPixels (scanLine1, scanLine2);

    //
    // If the RGB space of the input file is not the same as the ACES
    // RGB space, then the pixels in the frame buffer must be transformed
    // into the ACES RGB space.
    //

    if (!_data->mustConvertColor)
	return;

    int minY = min (scanLine1, scanLine2);
    int maxY = max (scanLine1, scanLine2);

    for (int y = minY; y <= maxY; ++y)
    {
	Rgba *base = _data->fbBase +
		     _data->fbXStride * _data->minX +
		     _data->fbYStride * y;

	for (int x = _data->minX; x <= _data->maxX; ++x)
	{
	    V3f aces = V3f (base->r, base->g, base->b) * _data->fileToAces;

	    base->r = aces[0];
	    base->g = aces[1];
	    base->b = aces[2];

	    base += _data->fbXStride;
	}
    }
}